

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *pPVar4;
  undefined4 *puVar5;
  undefined6 in_register_0000003a;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetPropertyIdFromCacheId(dumpFunction,(uint)data->inlineCacheIndex);
  pPVar4 = ScriptContext::GetPropertyName(this,propertyId);
  iVar2 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar2) {
  case 0x53:
  case 0x55:
  case 0x57:
  case 0x70:
  case 0x76:
  case 0x7a:
    Output::Print(L" R%d.%s = R%d #%d",(ulong)data->Instance,pPVar4 + 1,(ulong)data->Value,
                  (ulong)data->inlineCacheIndex);
    return;
  case 0x5e:
  case 0x60:
  case 0x66:
  case 0x68:
  case 0x6c:
switchD_0074f7c6_caseD_5e:
    Output::Print(L" R%d = R%d.%s #%d",(ulong)data->Value,(ulong)data->Instance,pPVar4 + 1,
                  (ulong)data->inlineCacheIndex);
    return;
  case 0x5f:
  case 0x61:
  case 0x67:
  case 0x69:
  case 0x6d:
    Output::Print(L" R%d = R%d.%s #%d",(ulong)data->Value,(ulong)data->Instance,pPVar4 + 1,
                  (ulong)data->inlineCacheIndex);
    break;
  case 0x71:
  case 0x77:
  case 0x7b:
    Output::Print(L" R%d.%s = R%d #%d",(ulong)data->Instance,pPVar4 + 1,(ulong)data->Value,
                  (ulong)data->inlineCacheIndex);
    break;
  default:
    if ((iVar2 == 0xa6) || (iVar2 == 0x85)) goto switchD_0074f7c6_caseD_5e;
  case 0x54:
  case 0x56:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x78:
  case 0x79:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x453,"(false)","Unknown OpCode for OpLayoutElementCP");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    return;
  }
  DumpProfileId((uint)data->inlineCacheIndex);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementCP(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyId propertyId = dumpFunction->GetPropertyIdFromCacheId(data->inlineCacheIndex);
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(propertyId);
        switch (op)
        {
            case OpCode::LdLen_A:
            case OpCode::LdFldForTypeOf:
            case OpCode::LdFld:
            case OpCode::LdFld_ReuseLoc:
            case OpCode::LdFldForCallApplyTarget:
            case OpCode::LdMethodFld:
            case OpCode::ScopedLdMethodFld:
            {
                Output::Print(_u(" R%d = R%d.%s #%d"), data->Value, data->Instance,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                break;
            }
            case OpCode::InitFld:
            case OpCode::InitLetFld:
            case OpCode::InitConstFld:
            case OpCode::StFld:
            case OpCode::StFldStrict:
            case OpCode::InitClassMember:
            {
                Output::Print(_u(" R%d.%s = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledLdFldForTypeOf:
            case OpCode::ProfiledLdFld:
            case OpCode::ProfiledLdFld_ReuseLoc:
            case OpCode::ProfiledLdFldForCallApplyTarget:
            case OpCode::ProfiledLdMethodFld:
            {
                Output::Print(_u(" R%d = R%d.%s #%d"), data->Value, data->Instance,
                        pPropertyName->GetBuffer(), data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            case OpCode::ProfiledInitFld:
            case OpCode::ProfiledStFld:
            case OpCode::ProfiledStFldStrict:
            {
                Output::Print(_u(" R%d.%s = R%d #%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value, data->inlineCacheIndex);
                DumpProfileId(data->inlineCacheIndex);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementCP");
                break;
            }
        }
    }